

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

int Saig_RefManSetPhases(Saig_RefMan_t *p,Abc_Cex_t *pCare,int fValue1)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Abc_Cex_t *pAVar5;
  void *pvVar6;
  bool bVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  
  puVar1 = &p->pFrames->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  pVVar9 = p->pFrames->vCis;
  if (0 < pVVar9->nSize) {
    lVar8 = 0;
    lVar11 = 0;
    do {
      lVar14 = (long)p->vMapPiF2A->nSize;
      if ((lVar14 <= lVar8) || (lVar14 <= lVar8 + 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = p->vMapPiF2A->pArray;
      iVar2 = piVar4[lVar8];
      iVar3 = piVar4[lVar8 + 1];
      pAVar5 = p->pCex;
      iVar10 = pAVar5->nRegs + iVar2 + pAVar5->nPis * iVar3;
      lVar14 = *(long *)((long)pVVar9->pArray + lVar8 * 4);
      uVar12 = *(ulong *)(lVar14 + 0x18) & 0xfffffffffffffff7;
      *(ulong *)(lVar14 + 0x18) =
           uVar12 + (ulong)((uint)(&pAVar5[1].iPo)[iVar10 >> 5] >> ((byte)iVar10 & 0x1f) & 1) * 8;
      if ((pCare != (Abc_Cex_t *)0x0) &&
         (uVar13 = iVar2 + p->pCex->nRegs + iVar3 * p->pCex->nPis,
         ((uint)(&pCare[1].iPo)[(int)uVar13 >> 5] >> (uVar13 & 0x1f) & 1) == 0)) {
        *(ulong *)(lVar14 + 0x18) = uVar12 | (fValue1 & 1U) << 3;
      }
      lVar11 = lVar11 + 1;
      pVVar9 = p->pFrames->vCis;
      lVar8 = lVar8 + 2;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = p->pFrames->vObjs;
  if (0 < pVVar9->nSize) {
    lVar8 = 0;
    do {
      pvVar6 = pVVar9->pArray[lVar8];
      if ((pvVar6 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar6 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar6 + 0x18) =
             (*(ulong *)((long)pvVar6 + 0x18) & 0xfffffffffffffff7) +
             (ulong)(((uint)*(ulong *)((long)pvVar6 + 0x10) ^
                     *(uint *)((*(ulong *)((long)pvVar6 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 3)
                     & ((uint)*(ulong *)((long)pvVar6 + 8) ^
                       *(uint *)((*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe) + 0x18) >> 3) &
                    1) * 8;
      }
      lVar8 = lVar8 + 1;
      pVVar9 = p->pFrames->vObjs;
    } while (lVar8 < pVVar9->nSize);
  }
  pVVar9 = p->pFrames->vCos;
  if (pVVar9->nSize < 1) {
    bVar7 = false;
  }
  else {
    lVar8 = 0;
    do {
      pvVar6 = pVVar9->pArray[lVar8];
      *(ulong *)((long)pvVar6 + 0x18) =
           *(ulong *)((long)pvVar6 + 0x18) & 0xfffffffffffffff7 |
           (ulong)(((int)*(ulong *)((long)pvVar6 + 8) << 3 ^
                   *(uint *)((*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe) + 0x18)) & 8);
      lVar8 = lVar8 + 1;
      pVVar9 = p->pFrames->vCos;
    } while (lVar8 < pVVar9->nSize);
    bVar7 = 0 < pVVar9->nSize;
  }
  if (bVar7) {
    return *(uint *)((long)*pVVar9->pArray + 0x18) >> 3 & 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_RefManSetPhases( Saig_RefMan_t * p, Abc_Cex_t * pCare, int fValue1 )
{
    Aig_Obj_t * pObj;
    int i, iFrame, iInput;
    Aig_ManConst1( p->pFrames )->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        // update value if it is a don't-care
        if ( pCare && !Abc_InfoHasBit( pCare->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput ) )
            pObj->fPhase = fValue1;
    }
    Aig_ManForEachNode( p->pFrames, pObj, i )
        pObj->fPhase = ( Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj) )
                     & ( Aig_ObjFanin1(pObj)->fPhase ^ Aig_ObjFaninC1(pObj) );
    Aig_ManForEachCo( p->pFrames, pObj, i )
        pObj->fPhase = ( Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj) );
    pObj = Aig_ManCo( p->pFrames, 0 );
    return pObj->fPhase;
}